

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void __thiscall
TPZFMatrix<long>::MultAdd
          (TPZFMatrix<long> *this,TPZFMatrix<long> *x,TPZFMatrix<long> *y,TPZFMatrix<long> *z,
          long alpha,long beta,int opt)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  char *msg1;
  int64_t i;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long *plVar13;
  
  if (opt == 0) {
    lVar2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  }
  else {
    lVar2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  }
  if (lVar2 != (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow) {
    msg1 = "TPZFMatrix::MultAdd matrix x with incompatible dimensions>";
LAB_00bd2977:
    Error(msg1,(char *)0x0);
    return;
  }
  if (beta != 0) {
    msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>";
    if (opt == 0) {
      lVar2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
    }
    else {
      lVar2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
    }
    if ((lVar2 != (y->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow) ||
       ((y->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol !=
        (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol)) goto LAB_00bd2977;
  }
  lVar2 = (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  lVar8 = (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  if (opt == 0) {
    if ((lVar2 == lVar8) &&
       ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow ==
        (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow)) goto LAB_00bd29ea;
  }
  else if ((lVar2 == lVar8) &&
          ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow ==
           (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol)) goto LAB_00bd29ea;
  (*(z->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])(z);
LAB_00bd29ea:
  if ((this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol == 0) {
    (*(z->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(z);
  }
  uVar3 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  uVar4 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  uVar12 = uVar4;
  if (opt == 0) {
    uVar12 = uVar3;
  }
  lVar2 = (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  uVar12 = uVar12 & 0xffffffff;
  if (0 < lVar2 && uVar12 != 0) {
    lVar8 = 0;
    lVar11 = 0;
    do {
      if (((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow < 1) ||
         ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= lVar11)) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (beta == 0) {
        memset(z->fElem + (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar11,0,uVar12 * 8)
        ;
      }
      else {
        if (z != y) {
          memcpy(z->fElem + (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar11,
                 y->fElem + (y->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar11,uVar12 * 8)
          ;
        }
        uVar10 = 0;
        do {
          if (((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow <= (long)uVar10) ||
             ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= lVar11)) {
            Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar8;
          *(long *)((long)z->fElem + uVar10 * 8 + lVar6) =
               *(long *)((long)z->fElem + uVar10 * 8 + lVar6) * beta;
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      lVar11 = lVar11 + 1;
      lVar8 = lVar8 + 8;
    } while (lVar11 != lVar2);
  }
  if (0 < lVar2 && (uVar3 != 0 && uVar4 != 0)) {
    lVar8 = 0;
    do {
      if (opt == 0) {
        if (0 < (long)uVar4) {
          uVar12 = 0;
          do {
            if (((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow < 1) ||
               ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= lVar8)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (0 < (long)uVar3) {
              plVar7 = z->fElem + (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar8;
              lVar11 = (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
              plVar5 = x->fElem;
              plVar13 = plVar7 + uVar3;
              plVar9 = this->fElem + uVar12 * uVar3;
              do {
                *plVar7 = *plVar7 + *plVar9 * alpha * plVar5[lVar11 * lVar8 + uVar12];
                plVar9 = plVar9 + 1;
                plVar7 = plVar7 + 1;
              } while (plVar7 < plVar13);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar4);
        }
      }
      else {
        plVar13 = this->fElem;
        if (((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow < 1) ||
           ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= lVar8)) {
          Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (0 < (long)uVar4) {
          plVar7 = z->fElem + (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar8;
          plVar5 = x->fElem;
          uVar12 = 0;
          do {
            if ((long)uVar3 < 1) {
              lVar11 = 0;
            }
            else {
              plVar9 = plVar5 + (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar8;
              plVar1 = plVar9 + uVar3;
              lVar11 = 0;
              do {
                lVar6 = *plVar13;
                plVar13 = plVar13 + 1;
                lVar11 = lVar11 + *plVar9 * lVar6;
                plVar9 = plVar9 + 1;
              } while (plVar9 < plVar1);
            }
            *plVar7 = *plVar7 + lVar11 * alpha;
            plVar7 = plVar7 + 1;
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar4);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar2);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta,const int opt) const {
    
    if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && this->Rows() != y.Rows()) || (opt && this->Cols() != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != this->Rows()) {
            z.Redim(this->Rows(),x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != this->Cols()) {
            z.Redim(this->Cols(),x.Cols());
        }
    }
    if(this->Cols() == 0)
    {
        z.Zero();
    }
    unsigned numeq = opt ? this->Cols() : this->Rows();
    int64_t rows = this->Rows();
    int64_t cols = this->Cols();
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if (numeq)
    {
        for (ic = 0; ic < xcols; ic++) {
            TVar *zp = &z(0,ic), *zlast = zp+numeq;
            if(beta != (TVar)0.) {
                const TVar *yp = &y.g(0,ic);
                if(&z != &y) {
                    memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
                }
                for(int64_t i=0; i< numeq; i++) z(i,ic) *= beta;
                
            } else {
                while(zp != zlast) {
                    *zp = 0.;
                    zp ++;
                }
            }
        }
    }
    
    if(!(rows*cols)) return;
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                TVar * fp = fElem +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            TVar * fp = fElem,  *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
}